

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestParsingMergeLite::Clear(TestParsingMergeLite *this)

{
  uint uVar1;
  TestAllTypesLite *pTVar2;
  TestParsingMergeLite_OptionalGroup *this_00;
  Nonnull<const_char_*> failure_msg;
  int line;
  LogMessageFatal local_20;
  
  google::protobuf::internal::ExtensionSet::Clear(&(this->field_0)._impl_._extensions_);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypesLite>>
            (&(this->field_0)._impl_.repeated_all_types_.super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestParsingMergeLite_RepeatedGroup>>
            (&(this->field_0)._impl_.repeatedgroup_.super_RepeatedPtrFieldBase);
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      pTVar2 = (this->field_0)._impl_.required_all_types_;
      if (pTVar2 == (TestAllTypesLite *)0x0) {
        failure_msg = "_impl_.required_all_types_ != nullptr";
        line = 0x21fd;
        goto LAB_0018bb14;
      }
      TestAllTypesLite::Clear(pTVar2);
    }
    if ((uVar1 & 2) != 0) {
      pTVar2 = (this->field_0)._impl_.optional_all_types_;
      if (pTVar2 == (TestAllTypesLite *)0x0) {
        failure_msg = "_impl_.optional_all_types_ != nullptr";
        line = 0x2201;
        goto LAB_0018bb14;
      }
      TestAllTypesLite::Clear(pTVar2);
    }
    if ((uVar1 & 4) != 0) {
      this_00 = (this->field_0)._impl_.optionalgroup_;
      if (this_00 == (TestParsingMergeLite_OptionalGroup *)0x0) {
        failure_msg = "_impl_.optionalgroup_ != nullptr";
        line = 0x2205;
LAB_0018bb14:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_20,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/google/protobuf/unittest_lite.pb.cc"
                   ,line,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
      }
      TestParsingMergeLite_OptionalGroup::Clear(this_00);
    }
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestParsingMergeLite::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestParsingMergeLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_._extensions_.Clear();
  _impl_.repeated_all_types_.Clear();
  _impl_.repeatedgroup_.Clear();
  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(_impl_.required_all_types_ != nullptr);
      _impl_.required_all_types_->Clear();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(_impl_.optional_all_types_ != nullptr);
      _impl_.optional_all_types_->Clear();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      ABSL_DCHECK(_impl_.optionalgroup_ != nullptr);
      _impl_.optionalgroup_->Clear();
    }
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<std::string>();
}